

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_thread.h
# Opt level: O1

void DrawerCommandQueue::QueueCommand<swrenderer::DrawColumnTranslatedPalCommand>(void)

{
  pointer *pppDVar1;
  iterator __position;
  DrawerCommandQueue *this;
  PalColumnCommand *this_00;
  DrawColumnTranslatedPalCommand command;
  PalColumnCommand local_78;
  
  this = Instance();
  if ((this->threaded_render == 0) || (r_multithreaded.Value == false)) {
    local_78._destblend = (uint32_t *)0x0;
    local_78._srccolor = 0;
    local_78._92_4_ = 0;
    local_78._color = 0;
    local_78._68_4_ = 0;
    local_78._srcblend = (uint32_t *)0x0;
    local_78._source = (uint8_t *)0x0;
    local_78._translation = (uint8_t *)0x0;
    local_78._texturefrac = 0;
    local_78._36_4_ = 0;
    local_78._colormap = (uint8_t *)0x0;
    local_78._dest = (uint8_t *)0x0;
    local_78._pitch = 0;
    local_78._iscale = 0;
    local_78.super_DrawerCommand._vptr_DrawerCommand = (_func_int **)0x0;
    local_78.super_DrawerCommand._dest_y = 0;
    local_78.super_DrawerCommand._12_4_ = 0;
    swrenderer::PalColumnCommand::PalColumnCommand(&local_78);
    local_78.super_DrawerCommand._vptr_DrawerCommand = (_func_int **)&PTR__DrawerCommand_006ef2b0;
    VectoredTryCatch(&local_78,
                     QueueCommand<swrenderer::DrawColumnTranslatedPalCommand>::
                     anon_class_1_0_00000001::__invoke,
                     QueueCommand<swrenderer::DrawColumnTranslatedPalCommand>::
                     anon_class_1_0_00000001::__invoke);
  }
  else {
    this_00 = (PalColumnCommand *)AllocMemory(0x60);
    if (this_00 == (PalColumnCommand *)0x0) {
      Finish(this);
      this_00 = (PalColumnCommand *)AllocMemory(0x60);
      if (this_00 == (PalColumnCommand *)0x0) {
        return;
      }
    }
    this_00->_destblend = (uint32_t *)0x0;
    *(undefined8 *)&this_00->_srccolor = 0;
    *(undefined8 *)&this_00->_color = 0;
    this_00->_srcblend = (uint32_t *)0x0;
    this_00->_source = (uint8_t *)0x0;
    this_00->_translation = (uint8_t *)0x0;
    *(undefined8 *)&this_00->_texturefrac = 0;
    this_00->_colormap = (uint8_t *)0x0;
    this_00->_dest = (uint8_t *)0x0;
    this_00->_pitch = 0;
    this_00->_iscale = 0;
    (this_00->super_DrawerCommand)._vptr_DrawerCommand = (_func_int **)0x0;
    *(undefined8 *)&(this_00->super_DrawerCommand)._dest_y = 0;
    swrenderer::PalColumnCommand::PalColumnCommand(this_00);
    (this_00->super_DrawerCommand)._vptr_DrawerCommand = (_func_int **)&PTR__DrawerCommand_006ef2b0;
    __position._M_current =
         (this->commands).super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->commands).super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_78.super_DrawerCommand._vptr_DrawerCommand = (_func_int **)this_00;
      std::vector<DrawerCommand*,std::allocator<DrawerCommand*>>::_M_realloc_insert<DrawerCommand*>
                ((vector<DrawerCommand*,std::allocator<DrawerCommand*>> *)&this->commands,__position
                 ,(DrawerCommand **)&local_78);
    }
    else {
      *__position._M_current = &this_00->super_DrawerCommand;
      pppDVar1 = &(this->commands).
                  super__Vector_base<DrawerCommand_*,_std::allocator<DrawerCommand_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppDVar1 = *pppDVar1 + 1;
    }
  }
  return;
}

Assistant:

static void QueueCommand(Types &&... args)
	{
		auto queue = Instance();
		if (queue->threaded_render == 0 || !r_multithreaded)
		{
			T command(std::forward<Types>(args)...);
			VectoredTryCatch(&command,
			[](void *data)
			{
				T *c = (T*)data;
				c->Execute(&Instance()->single_core_thread);
			},
			[](void *data, const char *reason, bool fatal)
			{
				T *c = (T*)data;
				ReportDrawerError(c, false, reason, fatal);
			});
		}
		else
		{
			void *ptr = AllocMemory(sizeof(T));
			if (!ptr) // Out of memory - render what we got
			{
				queue->Finish();
				ptr = AllocMemory(sizeof(T));
				if (!ptr)
					return;
			}
			T *command = new (ptr)T(std::forward<Types>(args)...);
			queue->commands.push_back(command);
		}
	}